

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_properties(PROPERTIES_HANDLE properties)

{
  AMQP_VALUE pAVar1;
  
  if (properties != (PROPERTIES_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(properties->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_properties(PROPERTIES_HANDLE properties)
{
    AMQP_VALUE result;

    if (properties == NULL)
    {
        result = NULL;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        result = amqpvalue_clone(properties_instance->composite_value);
    }

    return result;
}